

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O2

void __thiscall SMC::geometryinfo(SMC *this,string *fname)

{
  double dVar1;
  pointer pbVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int local_294;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  string line;
  ifstream input;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&input,(fname->_M_dataplus)._M_p,_S_in);
  local_294 = -1;
  iVar3 = 0;
  while ((abStack_218[*(long *)(_input + -0x18)] & 2) == 0) {
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&input,(string *)&line);
    if (*line._M_dataplus._M_p != '#') {
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      split(&line,' ',&token);
      pbVar2 = token.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)token.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)token.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar5 = (long)local_294;
      if (lVar4 == 1) {
        local_294 = local_294 + 1;
        dVar1 = atof(((token.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        this->EEdisBy[lVar5 + 1] = dVar1;
        iVar3 = 0;
      }
      else if (lVar4 == 0x25) {
        for (lVar4 = 0; lVar4 != 0x128; lVar4 = lVar4 + 8) {
          dVar1 = atof(*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar4 * 4));
          *(double *)((long)this->MtorsionEEdis[lVar5][iVar3] + lVar4) = dVar1;
        }
        iVar3 = iVar3 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&token);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void SMC::geometryinfo(string fname) {
    // Populate etedP collection of distance lengths
    // Conditional distribution
    ifstream input(fname.c_str());
    int Countset = 0, FraglenCount = -1;
    while (!input.eof()) {
        // Read line
        string line;
        getline(input, line);
        if (line[0] == '#') continue;

        // Tokenize by tabs
        vector<string> token;
        split(line, ' ', token);
        if (token.size() == 1) {
            FraglenCount++;
            Countset = 0;
            EEdisBy[FraglenCount] = atof(token[0].c_str());
        }
        else if (token.size() == 37) {
            for (int i = 0; i < 37; i++) {
                MtorsionEEdis[FraglenCount][Countset][i] = atof(token[i].c_str());
            }
            Countset++;

        }
    }
}